

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O0

TokenScanner * __thiscall TokenScanner::scanString_abi_cxx11_(TokenScanner *this)

{
  byte local_b1;
  allocator local_79;
  string local_78 [36];
  int local_54;
  byte local_4e;
  char local_4d;
  int ch;
  bool escape;
  char delim;
  allocator local_39;
  string local_38 [8];
  string token;
  TokenScanner *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_4d = std::istream::get();
  std::__cxx11::string::operator+=(local_38,local_4d);
  local_4e = 0;
  while( true ) {
    local_54 = std::istream::get();
    if (local_54 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"TokenScanner found unterminated string",&local_79);
      error((string *)local_78);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    if ((local_54 == local_4d) && ((local_4e & 1) == 0)) break;
    local_b1 = 0;
    if (local_54 == 0x5c) {
      local_b1 = local_4e ^ 0xff;
    }
    local_4e = local_b1 & 1;
    std::__cxx11::string::operator+=(local_38,(char)local_54);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char)local_38);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

string TokenScanner::scanString() {
   string token = "";
   char delim = isp->get();
   token += delim;
   bool escape = false;
   while (true) {
      int ch = isp->get();
      if (ch == EOF) error("TokenScanner found unterminated string");
      if (ch == delim && !escape) break;
      escape = (ch == '\\') && !escape;
      token += ch;
   }
   return token + delim;
}